

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmSystemTools.cxx
# Opt level: O0

FileFormat cmSystemTools::GetFileFormat(char *cext)

{
  bool bVar1;
  allocator local_39;
  undefined1 local_38 [8];
  string ext;
  char *cext_local;
  
  if ((cext != (char *)0x0) && (*cext != '\0')) {
    ext.field_2._8_8_ = cext;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)local_38,cext,&local_39);
    std::allocator<char>::~allocator((allocator<char> *)&local_39);
    bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            local_38,"c");
    if ((((bVar1) ||
         (bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)local_38,".c"), bVar1)) ||
        (bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)local_38,"m"), bVar1)) ||
       (bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )local_38,".m"), bVar1)) {
      cext_local._4_4_ = C_FILE_FORMAT;
    }
    else {
      bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              local_38,"C");
      if ((((((bVar1) ||
             (bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                       *)local_38,".C"), bVar1)) ||
            ((bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                       *)local_38,"M"), bVar1 ||
             ((bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                        *)local_38,".M"), bVar1 ||
              (bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                        *)local_38,"c++"), bVar1)))))) ||
           (bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)local_38,".c++"), bVar1)) ||
          (((bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                      *)local_38,"cc"), bVar1 ||
            (bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                      *)local_38,".cc"), bVar1)) ||
           (bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)local_38,"cpp"), bVar1)))) ||
         (((bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)local_38,".cpp"), bVar1 ||
           (bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)local_38,"cxx"), bVar1)) ||
          ((bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)local_38,".cxx"), bVar1 ||
           ((bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                      *)local_38,"mm"), bVar1 ||
            (bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                      *)local_38,".mm"), bVar1)))))))) {
        cext_local._4_4_ = CXX_FILE_FORMAT;
      }
      else {
        bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )local_38,"f");
        if ((((((bVar1) ||
               (bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                         *)local_38,".f"), bVar1)) ||
              (bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                        *)local_38,"F"), bVar1)) ||
             ((bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                        *)local_38,".F"), bVar1 ||
              (bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                        *)local_38,"f77"), bVar1)))) ||
            (bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                      *)local_38,".f77"), bVar1)) ||
           (((bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                       *)local_38,"f90"), bVar1 ||
             (bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                       *)local_38,".f90"), bVar1)) ||
            ((bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                       *)local_38,"for"), bVar1 ||
             (((bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                         *)local_38,".for"), bVar1 ||
               (bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                         *)local_38,"f95"), bVar1)) ||
              (bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                        *)local_38,".f95"), bVar1)))))))) {
          cext_local._4_4_ = FORTRAN_FILE_FORMAT;
        }
        else {
          bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)local_38,"java");
          if ((bVar1) ||
             (bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                       *)local_38,".java"), bVar1)) {
            cext_local._4_4_ = JAVA_FILE_FORMAT;
          }
          else {
            bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)local_38,"H");
            if ((((bVar1) ||
                 (bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                           *)local_38,".H"), bVar1)) ||
                ((bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                           *)local_38,"h"), bVar1 ||
                 (((bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                             *)local_38,".h"), bVar1 ||
                   (bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                             *)local_38,"h++"), bVar1)) ||
                  (bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                            *)local_38,".h++"), bVar1)))))) ||
               (((bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                           *)local_38,"hm"), bVar1 ||
                 (bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                           *)local_38,".hm"), bVar1)) ||
                ((bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                           *)local_38,"hpp"), bVar1 ||
                 (((bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                             *)local_38,".hpp"), bVar1 ||
                   (bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                             *)local_38,"hxx"), bVar1)) ||
                  ((bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                             *)local_38,".hxx"), bVar1 ||
                   ((((bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                *)local_38,"in"), bVar1 ||
                      (bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                *)local_38,".in"), bVar1)) ||
                     (bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                               *)local_38,"txx"), bVar1)) ||
                    (bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                              *)local_38,".txx"), bVar1)))))))))))) {
              cext_local._4_4_ = HEADER_FILE_FORMAT;
            }
            else {
              bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                       *)local_38,"rc");
              if ((bVar1) ||
                 (bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                           *)local_38,".rc"), bVar1)) {
                cext_local._4_4_ = RESOURCE_FILE_FORMAT;
              }
              else {
                bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                         *)local_38,"def");
                if ((bVar1) ||
                   (bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                             *)local_38,".def"), bVar1)) {
                  cext_local._4_4_ = DEFINITION_FILE_FORMAT;
                }
                else {
                  bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                           *)local_38,"lib");
                  if ((((bVar1) ||
                       (bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                 *)local_38,".lib"), bVar1)) ||
                      (bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                *)local_38,"a"), bVar1)) ||
                     (bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                               *)local_38,".a"), bVar1)) {
                    cext_local._4_4_ = STATIC_LIBRARY_FILE_FORMAT;
                  }
                  else {
                    bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                             *)local_38,"o");
                    if (((bVar1) ||
                        (bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)local_38,".o"), bVar1)) ||
                       ((bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)local_38,"obj"), bVar1 ||
                        (bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)local_38,".obj"), bVar1)))) {
                      cext_local._4_4_ = OBJECT_FILE_FORMAT;
                    }
                    else {
                      bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                               *)local_38,"so");
                      if (((bVar1) ||
                          (bVar1 = std::operator==((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)local_38,".so"), bVar1)) ||
                         ((bVar1 = std::operator==((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)local_38,"sl"), bVar1 ||
                          (((bVar1 = std::operator==((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)local_38,".sl"), bVar1 ||
                            (bVar1 = std::operator==((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)local_38,"dll"), bVar1)) ||
                           (bVar1 = std::operator==((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)local_38,".dll"), bVar1)))))) {
                        cext_local._4_4_ = SHARED_LIBRARY_FILE_FORMAT;
                      }
                      else {
                        cext_local._4_4_ = UNKNOWN_FILE_FORMAT;
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
    std::__cxx11::string::~string((string *)local_38);
    return cext_local._4_4_;
  }
  return NO_FILE_FORMAT;
}

Assistant:

cmSystemTools::FileFormat cmSystemTools::GetFileFormat(const char* cext)
{
  if (!cext || *cext == 0) {
    return cmSystemTools::NO_FILE_FORMAT;
  }
  // std::string ext = cmSystemTools::LowerCase(cext);
  std::string ext = cext;
  if (ext == "c" || ext == ".c" || ext == "m" || ext == ".m") {
    return cmSystemTools::C_FILE_FORMAT;
  }
  if (ext == "C" || ext == ".C" || ext == "M" || ext == ".M" || ext == "c++" ||
      ext == ".c++" || ext == "cc" || ext == ".cc" || ext == "cpp" ||
      ext == ".cpp" || ext == "cxx" || ext == ".cxx" || ext == "mm" ||
      ext == ".mm") {
    return cmSystemTools::CXX_FILE_FORMAT;
  }
  if (ext == "f" || ext == ".f" || ext == "F" || ext == ".F" || ext == "f77" ||
      ext == ".f77" || ext == "f90" || ext == ".f90" || ext == "for" ||
      ext == ".for" || ext == "f95" || ext == ".f95") {
    return cmSystemTools::FORTRAN_FILE_FORMAT;
  }
  if (ext == "java" || ext == ".java") {
    return cmSystemTools::JAVA_FILE_FORMAT;
  }
  if (ext == "H" || ext == ".H" || ext == "h" || ext == ".h" || ext == "h++" ||
      ext == ".h++" || ext == "hm" || ext == ".hm" || ext == "hpp" ||
      ext == ".hpp" || ext == "hxx" || ext == ".hxx" || ext == "in" ||
      ext == ".in" || ext == "txx" || ext == ".txx") {
    return cmSystemTools::HEADER_FILE_FORMAT;
  }
  if (ext == "rc" || ext == ".rc") {
    return cmSystemTools::RESOURCE_FILE_FORMAT;
  }
  if (ext == "def" || ext == ".def") {
    return cmSystemTools::DEFINITION_FILE_FORMAT;
  }
  if (ext == "lib" || ext == ".lib" || ext == "a" || ext == ".a") {
    return cmSystemTools::STATIC_LIBRARY_FILE_FORMAT;
  }
  if (ext == "o" || ext == ".o" || ext == "obj" || ext == ".obj") {
    return cmSystemTools::OBJECT_FILE_FORMAT;
  }
#ifdef __APPLE__
  if (ext == "dylib" || ext == ".dylib") {
    return cmSystemTools::SHARED_LIBRARY_FILE_FORMAT;
  }
  if (ext == "so" || ext == ".so" || ext == "bundle" || ext == ".bundle") {
    return cmSystemTools::MODULE_FILE_FORMAT;
  }
#else  // __APPLE__
  if (ext == "so" || ext == ".so" || ext == "sl" || ext == ".sl" ||
      ext == "dll" || ext == ".dll") {
    return cmSystemTools::SHARED_LIBRARY_FILE_FORMAT;
  }
#endif // __APPLE__
  return cmSystemTools::UNKNOWN_FILE_FORMAT;
}